

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::skip_escape(CTcTokenizer *this,utf8_ptr *p)

{
  byte bVar1;
  wchar_t wVar2;
  CTcTokenizer *this_00;
  utf8_ptr dst;
  char buf [10];
  utf8_ptr local_20;
  char local_12 [10];
  
  this_00 = (CTcTokenizer *)p->p_;
  wVar2 = utf8_ptr::s_getch((char *)this_00);
  if (wVar2 == L'\\') {
    local_20.p_ = local_12;
    xlat_escape(this_00,&local_20,p,L'\0',0);
  }
  else {
    bVar1 = *p->p_;
    p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
  }
  return;
}

Assistant:

void CTcTokenizer::skip_escape(utf8_ptr *p)
{
    if (p->getch() == '\\')
    {
        /* translate an escape into an empty buffer */
        char buf[10];
        utf8_ptr dst(buf);
        xlat_escape(&dst, p, 0, FALSE);
    }
    else
    {
        /* just skip the character */
        p->inc();
    }
}